

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alchitry_Loader.cpp
# Opt level: O0

bool read_from_file(string *file,PFT_PROGRAM_DATA ftData)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  ostream *poVar3;
  bool bVar4;
  undefined1 local_2c8 [8];
  CONFIG_DATA config;
  char local_228 [8];
  ifstream input_file;
  PFT_PROGRAM_DATA ftData_local;
  string *file_local;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Reading ");
  poVar3 = std::operator<<(poVar3,(string *)file);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  _Var2 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(local_228,(string *)file,_Var2);
  bVar1 = std::ifstream::is_open();
  bVar4 = (bVar1 & 1) != 0;
  if (bVar4) {
    std::istream::read(local_228,(long)local_2c8);
    config_to_ft(ftData,(CONFIG_DATA *)local_2c8);
    std::istream::read(local_228,0x1645a0);
    std::istream::read(local_228,0x1645c0);
    std::istream::read(local_228,0x1645d0);
    std::istream::read(local_228,0x164610);
    std::ifstream::close();
    ftData->Manufacturer = ManufacturerBuf;
    ftData->ManufacturerId = ManufacturerIdBuf;
    ftData->Description = DescriptionBuf;
    ftData->SerialNumber = SerialNumberBuf;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to open file ");
    poVar3 = std::operator<<(poVar3,(string *)file);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    file_local._7_1_ = 0;
  }
  config.IsFT1248H = '\0';
  config.FT1248CpolH = '\0';
  config.FT1248LsbH = '\0';
  config.IsFastSerH = !bVar4;
  std::ifstream::~ifstream(local_228);
  if (config._136_4_ == 0) {
    file_local._7_1_ = 1;
  }
  return (bool)(file_local._7_1_ & 1);
}

Assistant:

bool read_from_file(const string& file, PFT_PROGRAM_DATA ftData) {
    cout << "Reading " << file << endl;
    try {
        ifstream input_file(file, ios::in | ios::binary);
        if (!input_file.is_open()) {
            cerr << "Failed to open file " << file << endl;
            return false;
        }
        CONFIG_DATA config;

        input_file.read((char *) &config, sizeof(CONFIG_DATA));
        config_to_ft(ftData, &config);
        input_file.read(ManufacturerBuf, sizeof(ManufacturerBuf));
        input_file.read(ManufacturerIdBuf, sizeof(ManufacturerIdBuf));
        input_file.read(DescriptionBuf, sizeof(DescriptionBuf));
        input_file.read(SerialNumberBuf, sizeof(SerialNumberBuf));
        input_file.close();
        ftData->Manufacturer = ManufacturerBuf;
        ftData->ManufacturerId = ManufacturerIdBuf;
        ftData->Description = DescriptionBuf;
        ftData->SerialNumber = SerialNumberBuf;
    } catch (...) {
        cerr << "Failed to read file " << file << endl;
        return false;
    }
    return true;
}